

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O1

bool __thiscall QJsonPrivate::Parser::parseMember(Parser *this)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  byte bVar4;
  
  bVar2 = parseString(this);
  if (!bVar2) {
    return false;
  }
  pbVar3 = (byte *)this->json;
  pbVar1 = (byte *)this->end;
  bVar2 = pbVar3 < pbVar1;
  if (bVar2) {
    bVar4 = *pbVar3;
    if ((char)bVar4 < '!') {
      bVar2 = true;
      while ((pbVar3 = pbVar3 + 1, bVar4 < 0x21 &&
             ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
        this->json = (char *)pbVar3;
        bVar2 = pbVar3 < pbVar1;
        if ((pbVar3 == pbVar1) || (bVar4 = *pbVar3, ' ' < (char)bVar4)) break;
      }
      goto LAB_002f96e3;
    }
LAB_002f96e8:
    pbVar3 = (byte *)this->json;
    this->json = (char *)(pbVar3 + 1);
    bVar4 = *pbVar3;
    if ((((bVar4 - 0x22 < 0x3c) && ((0xa00000001000401U >> ((ulong)(bVar4 - 0x22) & 0x3f) & 1) != 0)
         ) || (bVar4 == 0x7b)) || (bVar4 == 0x7d)) goto LAB_002f971d;
  }
  else {
LAB_002f96e3:
    if (bVar2) goto LAB_002f96e8;
  }
  bVar4 = 0;
LAB_002f971d:
  if (bVar4 == 0x3a) {
    pbVar3 = (byte *)this->json;
    bVar2 = pbVar3 < pbVar1;
    if ((bVar2) && (bVar4 = *pbVar3, (char)bVar4 < '!')) {
      while ((pbVar3 = pbVar3 + 1, bVar4 < 0x21 &&
             ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
        this->json = (char *)pbVar3;
        bVar2 = pbVar3 < pbVar1;
        if ((pbVar3 == pbVar1) || (bVar4 = *pbVar3, ' ' < (char)bVar4)) break;
      }
    }
    if (bVar2) {
      bVar2 = parseValueIntoContainer(this);
      return bVar2;
    }
    this->lastError = UnterminatedObject;
  }
  else {
    this->lastError = MissingNameSeparator;
  }
  return false;
}

Assistant:

bool Parser::parseMember()
{
    if (!parseString())
        return false;
    char token = nextToken();
    if (token != NameSeparator) {
        lastError = QJsonParseError::MissingNameSeparator;
        return false;
    }
    if (!eatSpace()) {
        lastError = QJsonParseError::UnterminatedObject;
        return false;
    }

    return parseValueIntoContainer();
}